

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
decrement(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  bool bVar1;
  size_t offset;
  
  offset = this->current_;
  if (offset == 0) {
    offset = 0;
  }
  else {
    do {
      offset = offset - 1;
      bVar1 = valid_offset(this,offset);
      if (bVar1) break;
    } while (offset != 0);
  }
  update_current(this,offset);
  return;
}

Assistant:

void decrement()
                    {
                        size_t next = current_;
                        while(next>0) {
                            next--;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }